

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_utf8.c
# Opt level: O0

void t51(void)

{
  int iVar1;
  _Bool ok_2;
  _Bool ok_1;
  _Bool ok;
  ALLEGRO_USTR_INFO info;
  ALLEGRO_USTR *us;
  char str [256];
  undefined1 local_120 [16];
  undefined8 local_110;
  undefined1 local_108 [168];
  
  local_110 = al_ref_buffer(local_120,"Allegro",3);
  al_ustr_to_buffer(local_110,local_108,10);
  iVar1 = memcmp(local_108,"All",4);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == memcmp(str, \"All\", 4)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(str, \"All\", 4)");
    error = error + 1;
  }
  al_ustr_to_buffer(local_110,local_108,4);
  iVar1 = memcmp(local_108,"All",4);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == memcmp(str, \"All\", 4)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(str, \"All\", 4)");
    error = error + 1;
  }
  al_ustr_to_buffer(local_110,local_108,3);
  iVar1 = memcmp(local_108,"Al",3);
  if (iVar1 == 0) {
    log_printf("OK   %s\n","0 == memcmp(str, \"Al\", 3)");
  }
  else {
    log_printf("FAIL %s\n","0 == memcmp(str, \"Al\", 3)");
    error = error + 1;
  }
  return;
}

Assistant:

static void t51(void)
{
   char str[256];
   const ALLEGRO_USTR *us;
   ALLEGRO_USTR_INFO info;

   us = al_ref_buffer(&info, "Allegro", 3);
   al_ustr_to_buffer(us, str, 10);
   CHECK(0 == memcmp(str, "All", 4));
   al_ustr_to_buffer(us, str, 4);
   CHECK(0 == memcmp(str, "All", 4));
   al_ustr_to_buffer(us, str, 3);
   CHECK(0 == memcmp(str, "Al", 3));
}